

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Client * __thiscall
capnp::_::anon_unknown_0::TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
          (Client *__return_storage_ptr__,Vat *this,StringPtr to,bool unique)

{
  Reader vatId;
  Own<capnp::ClientHook,_std::nullptr_t> local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  Builder hostId;
  MallocMessageBuilder refMessage;
  
  MallocMessageBuilder::MallocMessageBuilder(&refMessage,0x80,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestSturdyRefHostId>
            (&hostId,&refMessage.super_MessageBuilder);
  capnproto_test::capnp::test::TestSturdyRefHostId::Builder::setHost(&hostId,(Reader)to.content);
  *(byte *)hostId._builder.data = *hostId._builder.data & 0xfe | unique;
  StructBuilder::asReader(&hostId._builder);
  vatId._reader.capTable = (CapTableReader *)uStack_170;
  vatId._reader.segment = (SegmentReader *)local_178;
  vatId._reader.data = (void *)local_168;
  vatId._reader.pointers = (WirePointer *)uStack_160;
  vatId._reader.dataSize = (undefined4)local_158;
  vatId._reader.pointerCount = local_158._4_2_;
  vatId._reader._38_2_ = local_158._6_2_;
  vatId._reader._40_8_ = uStack_150;
  RpcSystemBase::baseBootstrap((RpcSystemBase *)&local_188,vatId);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>
            (__return_storage_ptr__,(Client *)&local_188);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_188);
  MallocMessageBuilder::~MallocMessageBuilder(&refMessage);
  return __return_storage_ptr__;
}

Assistant:

typename T::Client connect(kj::StringPtr to, bool unique = false) {
      MallocMessageBuilder refMessage(128);
      auto hostId = refMessage.initRoot<test::TestSturdyRefHostId>();
      hostId.setHost(to);
      hostId.setUnique(unique);
      return rpcSystem.bootstrap(hostId).castAs<T>();
    }